

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

Var __thiscall Gluco::SimpSolver::newVar(SimpSolver *this,bool sign,bool dvar)

{
  char local_25;
  int local_24 [2];
  char local_1a [2];
  Var local_18;
  undefined1 local_12;
  undefined1 local_11;
  Var v;
  bool dvar_local;
  bool sign_local;
  SimpSolver *this_local;
  
  local_12 = dvar;
  local_11 = sign;
  _v = this;
  local_18 = Solver::newVar(&this->super_Solver,sign,dvar);
  local_1a[1] = 0;
  vec<char>::push(&this->frozen,local_1a + 1);
  local_1a[0] = '\0';
  vec<char>::push(&this->eliminated,local_1a);
  if ((this->use_simplification & 1U) != 0) {
    local_24[1] = 0;
    vec<int>::push(&this->n_occ,local_24 + 1);
    local_24[0] = 0;
    vec<int>::push(&this->n_occ,local_24);
    OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::init
              (&this->occurs,(EVP_PKEY_CTX *)&local_18);
    local_25 = '\0';
    vec<char>::push(&this->touched,&local_25);
    Heap<Gluco::SimpSolver::ElimLt>::insert(&this->elim_heap,local_18);
  }
  return local_18;
}

Assistant:

Var SimpSolver::newVar(bool sign, bool dvar) {
    Var v = Solver::newVar(sign, dvar);

    frozen    .push((char)false);
    eliminated.push((char)false);

    if (use_simplification){
        n_occ     .push(0);
        n_occ     .push(0);
        occurs    .init(v);
        touched   .push(0);
        elim_heap .insert(v);
    }
    return v; }